

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O3

void __thiscall PrintC::emitBlockSwitch(PrintC *this,BlockSwitch *bl)

{
  uint4 *__args;
  uint4 *puVar1;
  FlowBlock *pFVar2;
  pointer puVar3;
  EmitXml *pEVar4;
  pointer pCVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  iterator iVar9;
  long lVar10;
  ulong uVar11;
  
  __args = &(this->super_PrintLanguage).mods;
  iVar9._M_current =
       (this->super_PrintLanguage).modstack.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar8 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar9._M_current == puVar8) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               &(this->super_PrintLanguage).modstack,iVar9,__args);
    uVar6 = (this->super_PrintLanguage).mods;
    iVar9._M_current =
         (this->super_PrintLanguage).modstack.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar8 = (this->super_PrintLanguage).modstack.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    uVar6 = (this->super_PrintLanguage).mods;
    *iVar9._M_current = uVar6;
    iVar9._M_current = iVar9._M_current + 1;
    (this->super_PrintLanguage).modstack.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  *__args = uVar6 & 0xfffffe7f;
  if (iVar9._M_current == puVar8) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               &(this->super_PrintLanguage).modstack,iVar9,__args);
  }
  else {
    *iVar9._M_current = uVar6 & 0xfffffe7f;
    (this->super_PrintLanguage).modstack.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current + 1;
  }
  puVar1 = &(this->super_PrintLanguage).mods;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  pFVar2 = *(bl->super_BlockGraph).list.
            super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  (*pFVar2->_vptr_FlowBlock[0xc])(pFVar2,this);
  puVar3 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar4 = (this->super_PrintLanguage).emit;
  (this->super_PrintLanguage).mods = puVar3[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar3 + -1;
  (*pEVar4->_vptr_EmitXml[8])();
  iVar9._M_current =
       (this->super_PrintLanguage).modstack.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar9._M_current ==
      (this->super_PrintLanguage).modstack.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               &(this->super_PrintLanguage).modstack,iVar9,__args);
    uVar6 = (this->super_PrintLanguage).mods;
  }
  else {
    uVar6 = (this->super_PrintLanguage).mods;
    *iVar9._M_current = uVar6;
    (this->super_PrintLanguage).modstack.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current + 1;
  }
  (this->super_PrintLanguage).mods = uVar6 | 0x300;
  pFVar2 = *(bl->super_BlockGraph).list.
            super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  (*pFVar2->_vptr_FlowBlock[0xc])(pFVar2,this);
  puVar3 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar4 = (this->super_PrintLanguage).emit;
  (this->super_PrintLanguage).mods = puVar3[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar3 + -1;
  (*pEVar4->_vptr_EmitXml[0x21])(pEVar4,1,0);
  pEVar4 = (this->super_PrintLanguage).emit;
  (*pEVar4->_vptr_EmitXml[0x19])(pEVar4,"{",8);
  if (0 < (int)((ulong)((long)(bl->caseblocks).
                              super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(bl->caseblocks).
                             super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    lVar10 = 0;
    uVar11 = 0;
    do {
      emitSwitchCase(this,(int4)uVar11,bl);
      uVar6 = (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[0x22])();
      pCVar5 = (bl->caseblocks).
               super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)&pCVar5->gototype + lVar10) == 0) {
        pFVar2 = *(FlowBlock **)((long)&pCVar5->block + lVar10);
        pEVar4 = (this->super_PrintLanguage).emit;
        uVar7 = (*pEVar4->_vptr_EmitXml[6])(pEVar4,pFVar2);
        (*pFVar2->_vptr_FlowBlock[0xc])(pFVar2,this);
        pCVar5 = (bl->caseblocks).
                 super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((&pCVar5->isexit)[lVar10] == true) &&
           (uVar11 != (int)((ulong)((long)(bl->caseblocks).
                                          super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5)
                           >> 4) * -0x55555555 - 1)) {
          (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
          emitGotoStatement(this,pFVar2,(FlowBlock *)0x0,2);
        }
        pEVar4 = (this->super_PrintLanguage).emit;
        (*pEVar4->_vptr_EmitXml[7])(pEVar4,(ulong)uVar7);
      }
      else {
        (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
        pCVar5 = (bl->caseblocks).
                 super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        emitGotoStatement(this,*(bl->super_BlockGraph).list.
                                super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                          *(FlowBlock **)((long)&pCVar5->block + lVar10),
                          *(uint4 *)((long)&pCVar5->gototype + lVar10));
      }
      pEVar4 = (this->super_PrintLanguage).emit;
      (*pEVar4->_vptr_EmitXml[0x23])(pEVar4,(ulong)uVar6);
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x30;
    } while ((long)uVar11 <
             (long)((int)((ulong)((long)(bl->caseblocks).
                                        super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(bl->caseblocks).
                                       super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                   -0x55555555));
  }
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar4 = (this->super_PrintLanguage).emit;
  (*pEVar4->_vptr_EmitXml[0x19])(pEVar4,"}",8);
  puVar3 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_PrintLanguage).mods = puVar3[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar3 + -1;
  return;
}

Assistant:

void PrintC::emitBlockSwitch(const BlockSwitch *bl)

{
  FlowBlock *bl2;

  pushMod();
  unsetMod(no_branch|only_branch);
  pushMod();
  setMod(no_branch);
  bl->getSwitchBlock()->emit(this);
  popMod();
  emit->tagLine();
  pushMod();
  setMod(only_branch|comma_separate);
  bl->getSwitchBlock()->emit(this);
  popMod();
  emit->spaces(1);
  emit->print("{");

  for(int4 i=0;i<bl->getNumCaseBlocks();++i) {
    emitSwitchCase(i,bl);
    int4 id = emit->startIndent();
    if (bl->getGotoType(i)!=0) {
      emit->tagLine();
      emitGotoStatement(bl->getBlock(0),bl->getCaseBlock(i),bl->getGotoType(i));
    }
    else {
      bl2 = bl->getCaseBlock(i);
      int4 id2 = emit->beginBlock(bl2);
      bl2->emit(this);
      if (bl->isExit(i)&&(i!=bl->getNumCaseBlocks()-1)) {	// Blocks that formally exit the switch
	emit->tagLine();
	emitGotoStatement(bl2,(const FlowBlock *)0,FlowBlock::f_break_goto); // need an explicit break statement
      }
      emit->endBlock(id2);
    }
    emit->stopIndent(id);
  }
  emit->tagLine();
  emit->print("}");
  popMod();
}